

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

void __thiscall Electron::VideoOutput::emplace_pixel_line(VideoOutput *this)

{
  int local_38 [10];
  VideoOutput *local_10;
  VideoOutput *this_local;
  
  local_38[9] = 0;
  local_38[8] = 9;
  local_10 = this;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)&this->screen_map_,(Type *)(local_38 + 9),local_38 + 8);
  local_38[7] = 1;
  local_38[6] = 0xf;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)&this->screen_map_,(Type *)(local_38 + 7),local_38 + 6);
  local_38[5] = 2;
  local_38[4] = 9;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)&this->screen_map_,(Type *)(local_38 + 5),local_38 + 4);
  local_38[3] = 3;
  local_38[2] = 0x50;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)&this->screen_map_,(Type *)(local_38 + 3),local_38 + 2);
  local_38[1] = 2;
  local_38[0] = 0xf;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)&this->screen_map_,(Type *)(local_38 + 1),local_38);
  return;
}

Assistant:

void VideoOutput::emplace_pixel_line() {
	// output format is:
	// 9 cycles: sync
	// ... to 24 cycles: colour burst
	// ... to first_graphics_cycle: blank
	// ... for 80 cycles: pixels
	// ... until end of line: blank
	screen_map_.emplace_back(DrawAction::Sync, 9);
	screen_map_.emplace_back(DrawAction::ColourBurst, 24 - 9);
	screen_map_.emplace_back(DrawAction::Blank, first_graphics_cycle - 24);
	screen_map_.emplace_back(DrawAction::Pixels, 80);
	screen_map_.emplace_back(DrawAction::Blank, 48 - first_graphics_cycle);
}